

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O1

void ihevc_inter_pred_luma_vert_w16out_ssse3
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  WORD16 *pWVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  WORD16 *pWVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar12 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar13 [16];
  undefined1 uVar42;
  undefined1 uVar43;
  undefined1 uVar44;
  undefined1 uVar45;
  undefined1 uVar46;
  undefined1 uVar47;
  undefined1 uVar48;
  undefined1 auVar14 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar49 [16];
  undefined1 auVar57 [16];
  undefined1 uVar79;
  undefined1 uVar80;
  undefined1 uVar81;
  undefined1 uVar82;
  undefined1 uVar83;
  undefined1 uVar84;
  undefined1 uVar85;
  undefined1 auVar64 [16];
  undefined1 auVar72 [16];
  undefined1 auVar86 [16];
  undefined1 auVar94 [16];
  undefined1 auVar101 [16];
  undefined1 auVar109 [16];
  undefined1 auVar117 [16];
  undefined1 auVar125 [16];
  undefined1 auVar133 [16];
  undefined1 auVar141 [16];
  undefined1 auVar149 [16];
  undefined1 auVar157 [16];
  undefined1 auVar165 [16];
  undefined1 auVar173 [16];
  undefined1 auVar181 [16];
  undefined1 auVar188 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar214 [16];
  undefined1 auVar221 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar251 [16];
  WORD16 *local_a0;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)pi1_coeff;
  auVar11 = pshuflw(in_XMM1,auVar10,0);
  auVar11._4_4_ = auVar11._0_4_;
  auVar11._8_4_ = auVar11._0_4_;
  auVar11._12_4_ = auVar11._0_4_;
  auVar12 = pshuflw(in_XMM2,auVar10,0x55);
  auVar12._4_4_ = auVar12._0_4_;
  auVar12._8_4_ = auVar12._0_4_;
  auVar12._12_4_ = auVar12._0_4_;
  auVar13 = pshuflw(in_XMM3,auVar10,0xaa);
  auVar13._4_4_ = auVar13._0_4_;
  auVar13._8_4_ = auVar13._0_4_;
  auVar13._12_4_ = auVar13._0_4_;
  auVar10 = pshufb(auVar10,_DAT_00171770);
  if ((wd & 7U) == 0) {
    if (0 < wd) {
      lVar8 = (long)src_strd;
      local_a0 = pi2_dst + (dst_strd << 2);
      uVar6 = 0;
      do {
        pWVar1 = pi2_dst + uVar6;
        uVar2 = *(ulong *)(pu1_src + lVar8 * -3 + uVar6);
        uVar3 = *(ulong *)(pu1_src + lVar8 * -2 + uVar6);
        uVar47 = (undefined1)(uVar3 >> 0x38);
        auVar34._8_6_ = 0;
        auVar34._0_8_ = uVar2;
        auVar34[0xe] = (char)(uVar2 >> 0x38);
        auVar34[0xf] = uVar47;
        auVar33._14_2_ = auVar34._14_2_;
        auVar33._8_5_ = 0;
        auVar33._0_8_ = uVar2;
        uVar46 = (undefined1)(uVar3 >> 0x30);
        auVar33[0xd] = uVar46;
        auVar32._13_3_ = auVar33._13_3_;
        auVar32._8_4_ = 0;
        auVar32._0_8_ = uVar2;
        auVar32[0xc] = (char)(uVar2 >> 0x30);
        auVar31._12_4_ = auVar32._12_4_;
        auVar31._8_3_ = 0;
        auVar31._0_8_ = uVar2;
        uVar45 = (undefined1)(uVar3 >> 0x28);
        auVar31[0xb] = uVar45;
        auVar251._11_5_ = auVar31._11_5_;
        auVar251._8_2_ = 0;
        auVar251._0_8_ = uVar2;
        auVar251[10] = (char)(uVar2 >> 0x28);
        auVar242._10_6_ = auVar251._10_6_;
        auVar242[8] = 0;
        auVar242._0_8_ = uVar2;
        uVar44 = (undefined1)(uVar3 >> 0x20);
        auVar242[9] = uVar44;
        auVar241._9_7_ = auVar242._9_7_;
        auVar241[8] = (char)(uVar2 >> 0x20);
        auVar241._0_8_ = uVar2;
        auVar231._8_8_ = auVar241._8_8_;
        uVar43 = (undefined1)(uVar3 >> 0x18);
        auVar231[7] = uVar43;
        auVar231[6] = (char)(uVar2 >> 0x18);
        uVar42 = (undefined1)(uVar3 >> 0x10);
        auVar231[5] = uVar42;
        auVar231[4] = (char)(uVar2 >> 0x10);
        uVar79 = (undefined1)(uVar3 >> 8);
        auVar231[3] = uVar79;
        auVar231[2] = (char)(uVar2 >> 8);
        auVar231[0] = (undefined1)uVar2;
        auVar141[0] = (undefined1)uVar3;
        auVar231[1] = auVar141[0];
        auVar205 = pmaddubsw(auVar231,auVar11);
        uVar2 = *(ulong *)(pu1_src + (uVar6 - lVar8));
        uVar4 = *(ulong *)(pu1_src + uVar6);
        uVar48 = (undefined1)(uVar2 >> 0x38);
        auVar148._8_6_ = 0;
        auVar148._0_8_ = uVar3;
        auVar148[0xe] = uVar47;
        auVar148[0xf] = uVar48;
        uVar47 = (undefined1)(uVar2 >> 0x30);
        auVar147._14_2_ = auVar148._14_2_;
        auVar147._8_5_ = 0;
        auVar147._0_8_ = uVar3;
        auVar147[0xd] = uVar47;
        auVar146._13_3_ = auVar147._13_3_;
        auVar146._8_4_ = 0;
        auVar146._0_8_ = uVar3;
        auVar146[0xc] = uVar46;
        uVar46 = (undefined1)(uVar2 >> 0x28);
        auVar145._12_4_ = auVar146._12_4_;
        auVar145._8_3_ = 0;
        auVar145._0_8_ = uVar3;
        auVar145[0xb] = uVar46;
        auVar144._11_5_ = auVar145._11_5_;
        auVar144._8_2_ = 0;
        auVar144._0_8_ = uVar3;
        auVar144[10] = uVar45;
        uVar45 = (undefined1)(uVar2 >> 0x20);
        auVar143._10_6_ = auVar144._10_6_;
        auVar143[8] = 0;
        auVar143._0_8_ = uVar3;
        auVar143[9] = uVar45;
        auVar142._9_7_ = auVar143._9_7_;
        auVar142[8] = uVar44;
        auVar142._0_8_ = uVar3;
        uVar44 = (undefined1)(uVar2 >> 0x18);
        auVar141._8_8_ = auVar142._8_8_;
        auVar141[7] = uVar44;
        auVar141[6] = uVar43;
        uVar43 = (undefined1)(uVar2 >> 0x10);
        auVar141[5] = uVar43;
        auVar141[4] = uVar42;
        uVar42 = (undefined1)(uVar2 >> 8);
        auVar141[3] = uVar42;
        auVar141[2] = uVar79;
        auVar141[1] = (char)uVar2;
        uVar84 = (undefined1)(uVar4 >> 0x38);
        auVar180._8_6_ = 0;
        auVar180._0_8_ = uVar2;
        auVar180[0xe] = uVar48;
        auVar180[0xf] = uVar84;
        uVar83 = (undefined1)(uVar4 >> 0x30);
        auVar179._14_2_ = auVar180._14_2_;
        auVar179._8_5_ = 0;
        auVar179._0_8_ = uVar2;
        auVar179[0xd] = uVar83;
        auVar178._13_3_ = auVar179._13_3_;
        auVar178._8_4_ = 0;
        auVar178._0_8_ = uVar2;
        auVar178[0xc] = uVar47;
        uVar82 = (undefined1)(uVar4 >> 0x28);
        auVar177._12_4_ = auVar178._12_4_;
        auVar177._8_3_ = 0;
        auVar177._0_8_ = uVar2;
        auVar177[0xb] = uVar82;
        auVar176._11_5_ = auVar177._11_5_;
        auVar176._8_2_ = 0;
        auVar176._0_8_ = uVar2;
        auVar176[10] = uVar46;
        uVar81 = (undefined1)(uVar4 >> 0x20);
        auVar175._10_6_ = auVar176._10_6_;
        auVar175[8] = 0;
        auVar175._0_8_ = uVar2;
        auVar175[9] = uVar81;
        auVar174._9_7_ = auVar175._9_7_;
        auVar174[8] = uVar45;
        auVar174._0_8_ = uVar2;
        uVar80 = (undefined1)(uVar4 >> 0x18);
        auVar173._8_8_ = auVar174._8_8_;
        auVar173[7] = uVar80;
        auVar173[6] = uVar44;
        uVar79 = (undefined1)(uVar4 >> 0x10);
        auVar173[5] = uVar79;
        auVar173[4] = uVar43;
        uVar48 = (undefined1)(uVar4 >> 8);
        auVar173[3] = uVar48;
        auVar173[2] = uVar42;
        auVar117[0] = (undefined1)uVar4;
        auVar173[1] = auVar117[0];
        auVar173[0] = (char)uVar2;
        auVar230 = pmaddubsw(auVar173,auVar12);
        uVar2 = *(ulong *)(pu1_src + lVar8 + uVar6);
        uVar3 = *(ulong *)(pu1_src + (long)(src_strd * 2) + uVar6);
        uVar47 = (undefined1)(uVar2 >> 0x38);
        auVar124._8_6_ = 0;
        auVar124._0_8_ = uVar4;
        auVar124[0xe] = uVar84;
        auVar124[0xf] = uVar47;
        uVar46 = (undefined1)(uVar2 >> 0x30);
        auVar123._14_2_ = auVar124._14_2_;
        auVar123._8_5_ = 0;
        auVar123._0_8_ = uVar4;
        auVar123[0xd] = uVar46;
        auVar122._13_3_ = auVar123._13_3_;
        auVar122._8_4_ = 0;
        auVar122._0_8_ = uVar4;
        auVar122[0xc] = uVar83;
        uVar45 = (undefined1)(uVar2 >> 0x28);
        auVar121._12_4_ = auVar122._12_4_;
        auVar121._8_3_ = 0;
        auVar121._0_8_ = uVar4;
        auVar121[0xb] = uVar45;
        auVar120._11_5_ = auVar121._11_5_;
        auVar120._8_2_ = 0;
        auVar120._0_8_ = uVar4;
        auVar120[10] = uVar82;
        uVar44 = (undefined1)(uVar2 >> 0x20);
        auVar119._10_6_ = auVar120._10_6_;
        auVar119[8] = 0;
        auVar119._0_8_ = uVar4;
        auVar119[9] = uVar44;
        auVar118._9_7_ = auVar119._9_7_;
        auVar118[8] = uVar81;
        auVar118._0_8_ = uVar4;
        uVar43 = (undefined1)(uVar2 >> 0x18);
        auVar117._8_8_ = auVar118._8_8_;
        auVar117[7] = uVar43;
        auVar117[6] = uVar80;
        uVar42 = (undefined1)(uVar2 >> 0x10);
        auVar117[5] = uVar42;
        auVar117[4] = uVar79;
        uVar79 = (undefined1)(uVar2 >> 8);
        auVar117[3] = uVar79;
        auVar117[2] = uVar48;
        auVar232[0] = (undefined1)uVar2;
        auVar117[1] = auVar232[0];
        uVar48 = (undefined1)(uVar3 >> 0x38);
        auVar100._8_6_ = 0;
        auVar100._0_8_ = uVar2;
        auVar100[0xe] = uVar47;
        auVar100[0xf] = uVar48;
        uVar47 = (undefined1)(uVar3 >> 0x30);
        auVar99._14_2_ = auVar100._14_2_;
        auVar99._8_5_ = 0;
        auVar99._0_8_ = uVar2;
        auVar99[0xd] = uVar47;
        auVar98._13_3_ = auVar99._13_3_;
        auVar98._8_4_ = 0;
        auVar98._0_8_ = uVar2;
        auVar98[0xc] = uVar46;
        uVar46 = (undefined1)(uVar3 >> 0x28);
        auVar97._12_4_ = auVar98._12_4_;
        auVar97._8_3_ = 0;
        auVar97._0_8_ = uVar2;
        auVar97[0xb] = uVar46;
        auVar96._11_5_ = auVar97._11_5_;
        auVar96._8_2_ = 0;
        auVar96._0_8_ = uVar2;
        auVar96[10] = uVar45;
        uVar45 = (undefined1)(uVar3 >> 0x20);
        auVar95._10_6_ = auVar96._10_6_;
        auVar95[8] = 0;
        auVar95._0_8_ = uVar2;
        auVar95[9] = uVar45;
        auVar94._9_7_ = auVar95._9_7_;
        auVar94[8] = uVar44;
        auVar94._0_8_ = uVar2;
        uVar44 = (undefined1)(uVar3 >> 0x18);
        auVar232._8_8_ = auVar94._8_8_;
        auVar232[7] = uVar44;
        auVar232[6] = uVar43;
        uVar43 = (undefined1)(uVar3 >> 0x10);
        auVar232[5] = uVar43;
        auVar232[4] = uVar42;
        uVar42 = (undefined1)(uVar3 >> 8);
        auVar232[3] = uVar42;
        auVar232[2] = uVar79;
        auVar22[0] = (undefined1)uVar3;
        auVar232[1] = auVar22[0];
        auVar231 = pmaddubsw(auVar232,auVar13);
        uVar2 = *(ulong *)(pu1_src + (long)(src_strd * 3) + uVar6);
        uVar4 = *(ulong *)(pu1_src + (long)(src_strd * 4) + uVar6);
        uVar85 = (undefined1)(uVar2 >> 0x38);
        auVar41._8_6_ = 0;
        auVar41._0_8_ = uVar3;
        auVar41[0xe] = uVar48;
        auVar41[0xf] = uVar85;
        auVar40._14_2_ = auVar41._14_2_;
        auVar40._8_5_ = 0;
        auVar40._0_8_ = uVar3;
        uVar84 = (undefined1)(uVar2 >> 0x30);
        auVar40[0xd] = uVar84;
        auVar39._13_3_ = auVar40._13_3_;
        auVar39._8_4_ = 0;
        auVar39._0_8_ = uVar3;
        auVar39[0xc] = uVar47;
        auVar38._12_4_ = auVar39._12_4_;
        auVar38._8_3_ = 0;
        auVar38._0_8_ = uVar3;
        uVar83 = (undefined1)(uVar2 >> 0x28);
        auVar38[0xb] = uVar83;
        auVar37._11_5_ = auVar38._11_5_;
        auVar37._8_2_ = 0;
        auVar37._0_8_ = uVar3;
        auVar37[10] = uVar46;
        auVar36._10_6_ = auVar37._10_6_;
        auVar36[8] = 0;
        auVar36._0_8_ = uVar3;
        uVar82 = (undefined1)(uVar2 >> 0x20);
        auVar36[9] = uVar82;
        auVar35._9_7_ = auVar36._9_7_;
        auVar35[8] = uVar45;
        auVar35._0_8_ = uVar3;
        auVar22._8_8_ = auVar35._8_8_;
        uVar81 = (undefined1)(uVar2 >> 0x18);
        auVar22[7] = uVar81;
        auVar22[6] = uVar44;
        uVar80 = (undefined1)(uVar2 >> 0x10);
        auVar22[5] = uVar80;
        auVar22[4] = uVar43;
        uVar79 = (undefined1)(uVar2 >> 8);
        auVar22[3] = uVar79;
        auVar22[2] = uVar42;
        auVar229[0] = (undefined1)uVar2;
        auVar22[1] = auVar229[0];
        uVar48 = (undefined1)(uVar4 >> 0x38);
        auVar78._8_6_ = 0;
        auVar78._0_8_ = uVar2;
        auVar78[0xe] = uVar85;
        auVar78[0xf] = uVar48;
        uVar47 = (undefined1)(uVar4 >> 0x30);
        auVar77._14_2_ = auVar78._14_2_;
        auVar77._8_5_ = 0;
        auVar77._0_8_ = uVar2;
        auVar77[0xd] = uVar47;
        auVar76._13_3_ = auVar77._13_3_;
        auVar76._8_4_ = 0;
        auVar76._0_8_ = uVar2;
        auVar76[0xc] = uVar84;
        uVar46 = (undefined1)(uVar4 >> 0x28);
        auVar75._12_4_ = auVar76._12_4_;
        auVar75._8_3_ = 0;
        auVar75._0_8_ = uVar2;
        auVar75[0xb] = uVar46;
        auVar74._11_5_ = auVar75._11_5_;
        auVar74._8_2_ = 0;
        auVar74._0_8_ = uVar2;
        auVar74[10] = uVar83;
        uVar45 = (undefined1)(uVar4 >> 0x20);
        auVar73._10_6_ = auVar74._10_6_;
        auVar73[8] = 0;
        auVar73._0_8_ = uVar2;
        auVar73[9] = uVar45;
        auVar72._9_7_ = auVar73._9_7_;
        auVar72[8] = uVar82;
        auVar72._0_8_ = uVar2;
        uVar44 = (undefined1)(uVar4 >> 0x18);
        auVar229._8_8_ = auVar72._8_8_;
        auVar229[7] = uVar44;
        auVar229[6] = uVar81;
        uVar43 = (undefined1)(uVar4 >> 0x10);
        auVar229[5] = uVar43;
        auVar229[4] = uVar80;
        uVar42 = (undefined1)(uVar4 >> 8);
        auVar229[3] = uVar42;
        auVar229[2] = uVar79;
        auVar196[0] = (undefined1)uVar4;
        auVar229[1] = auVar196[0];
        auVar241 = pmaddubsw(auVar229,auVar10);
        *pWVar1 = auVar241._0_2_ + auVar231._0_2_ + auVar230._0_2_ + auVar205._0_2_;
        pWVar1[1] = auVar241._2_2_ + auVar231._2_2_ + auVar230._2_2_ + auVar205._2_2_;
        pWVar1[2] = auVar241._4_2_ + auVar231._4_2_ + auVar230._4_2_ + auVar205._4_2_;
        pWVar1[3] = auVar241._6_2_ + auVar231._6_2_ + auVar230._6_2_ + auVar205._6_2_;
        pWVar1[4] = auVar241._8_2_ + auVar231._8_2_ + auVar230._8_2_ + auVar205._8_2_;
        pWVar1[5] = auVar241._10_2_ + auVar231._10_2_ + auVar230._10_2_ + auVar205._10_2_;
        pWVar1[6] = auVar241._12_2_ + auVar231._12_2_ + auVar230._12_2_ + auVar205._12_2_;
        pWVar1[7] = auVar241._14_2_ + auVar231._14_2_ + auVar230._14_2_ + auVar205._14_2_;
        auVar231 = pmaddubsw(auVar173,auVar11);
        auVar241 = pmaddubsw(auVar232,auVar12);
        auVar242 = pmaddubsw(auVar229,auVar13);
        uVar2 = *(ulong *)(pu1_src + (long)(src_strd * 5) + uVar6);
        uVar3 = *(ulong *)(pu1_src + (long)(src_strd * 6) + uVar6);
        uVar85 = (undefined1)(uVar2 >> 0x38);
        auVar63._8_6_ = 0;
        auVar63._0_8_ = uVar4;
        auVar63[0xe] = uVar48;
        auVar63[0xf] = uVar85;
        auVar62._14_2_ = auVar63._14_2_;
        auVar62._8_5_ = 0;
        auVar62._0_8_ = uVar4;
        uVar84 = (undefined1)(uVar2 >> 0x30);
        auVar62[0xd] = uVar84;
        auVar61._13_3_ = auVar62._13_3_;
        auVar61._8_4_ = 0;
        auVar61._0_8_ = uVar4;
        auVar61[0xc] = uVar47;
        auVar60._12_4_ = auVar61._12_4_;
        auVar60._8_3_ = 0;
        auVar60._0_8_ = uVar4;
        uVar83 = (undefined1)(uVar2 >> 0x28);
        auVar60[0xb] = uVar83;
        auVar59._11_5_ = auVar60._11_5_;
        auVar59._8_2_ = 0;
        auVar59._0_8_ = uVar4;
        auVar59[10] = uVar46;
        auVar58._10_6_ = auVar59._10_6_;
        auVar58[8] = 0;
        auVar58._0_8_ = uVar4;
        uVar82 = (undefined1)(uVar2 >> 0x20);
        auVar58[9] = uVar82;
        auVar57._9_7_ = auVar58._9_7_;
        auVar57[8] = uVar45;
        auVar57._0_8_ = uVar4;
        auVar196._8_8_ = auVar57._8_8_;
        uVar81 = (undefined1)(uVar2 >> 0x18);
        auVar196[7] = uVar81;
        auVar196[6] = uVar44;
        uVar80 = (undefined1)(uVar2 >> 0x10);
        auVar196[5] = uVar80;
        auVar196[4] = uVar43;
        uVar79 = (undefined1)(uVar2 >> 8);
        auVar196[3] = uVar79;
        auVar196[2] = uVar42;
        auVar230[0] = (undefined1)uVar2;
        auVar196[1] = auVar230[0];
        uVar48 = (undefined1)(uVar3 >> 0x38);
        auVar220._8_6_ = 0;
        auVar220._0_8_ = uVar2;
        auVar220[0xe] = uVar85;
        auVar220[0xf] = uVar48;
        uVar47 = (undefined1)(uVar3 >> 0x30);
        auVar219._14_2_ = auVar220._14_2_;
        auVar219._8_5_ = 0;
        auVar219._0_8_ = uVar2;
        auVar219[0xd] = uVar47;
        auVar218._13_3_ = auVar219._13_3_;
        auVar218._8_4_ = 0;
        auVar218._0_8_ = uVar2;
        auVar218[0xc] = uVar84;
        uVar46 = (undefined1)(uVar3 >> 0x28);
        auVar217._12_4_ = auVar218._12_4_;
        auVar217._8_3_ = 0;
        auVar217._0_8_ = uVar2;
        auVar217[0xb] = uVar46;
        auVar216._11_5_ = auVar217._11_5_;
        auVar216._8_2_ = 0;
        auVar216._0_8_ = uVar2;
        auVar216[10] = uVar83;
        uVar45 = (undefined1)(uVar3 >> 0x20);
        auVar215._10_6_ = auVar216._10_6_;
        auVar215[8] = 0;
        auVar215._0_8_ = uVar2;
        auVar215[9] = uVar45;
        auVar214._9_7_ = auVar215._9_7_;
        auVar214[8] = uVar82;
        auVar214._0_8_ = uVar2;
        uVar44 = (undefined1)(uVar3 >> 0x18);
        auVar230._8_8_ = auVar214._8_8_;
        auVar230[7] = uVar44;
        auVar230[6] = uVar81;
        uVar43 = (undefined1)(uVar3 >> 0x10);
        auVar230[5] = uVar43;
        auVar230[4] = uVar80;
        uVar42 = (undefined1)(uVar3 >> 8);
        auVar230[3] = uVar42;
        auVar230[2] = uVar79;
        auVar205[0] = (undefined1)uVar3;
        auVar230[1] = auVar205[0];
        auVar251 = pmaddubsw(auVar230,auVar10);
        pWVar5 = pWVar1 + dst_strd * 2;
        *pWVar5 = auVar251._0_2_ + auVar242._0_2_ + auVar241._0_2_ + auVar231._0_2_;
        pWVar5[1] = auVar251._2_2_ + auVar242._2_2_ + auVar241._2_2_ + auVar231._2_2_;
        pWVar5[2] = auVar251._4_2_ + auVar242._4_2_ + auVar241._4_2_ + auVar231._4_2_;
        pWVar5[3] = auVar251._6_2_ + auVar242._6_2_ + auVar241._6_2_ + auVar231._6_2_;
        pWVar5[4] = auVar251._8_2_ + auVar242._8_2_ + auVar241._8_2_ + auVar231._8_2_;
        pWVar5[5] = auVar251._10_2_ + auVar242._10_2_ + auVar241._10_2_ + auVar231._10_2_;
        pWVar5[6] = auVar251._12_2_ + auVar242._12_2_ + auVar241._12_2_ + auVar231._12_2_;
        pWVar5[7] = auVar251._14_2_ + auVar242._14_2_ + auVar241._14_2_ + auVar231._14_2_;
        auVar231 = pmaddubsw(auVar141,auVar11);
        auVar242 = pmaddubsw(auVar117,auVar12);
        auVar241 = pmaddubsw(auVar22,auVar13);
        auVar251 = pmaddubsw(auVar196,auVar10);
        pWVar5 = pWVar1 + dst_strd;
        *pWVar5 = auVar251._0_2_ + auVar241._0_2_ + auVar242._0_2_ + auVar231._0_2_;
        pWVar5[1] = auVar251._2_2_ + auVar241._2_2_ + auVar242._2_2_ + auVar231._2_2_;
        pWVar5[2] = auVar251._4_2_ + auVar241._4_2_ + auVar242._4_2_ + auVar231._4_2_;
        pWVar5[3] = auVar251._6_2_ + auVar241._6_2_ + auVar242._6_2_ + auVar231._6_2_;
        pWVar5[4] = auVar251._8_2_ + auVar241._8_2_ + auVar242._8_2_ + auVar231._8_2_;
        pWVar5[5] = auVar251._10_2_ + auVar241._10_2_ + auVar242._10_2_ + auVar231._10_2_;
        pWVar5[6] = auVar251._12_2_ + auVar241._12_2_ + auVar242._12_2_ + auVar231._12_2_;
        pWVar5[7] = auVar251._14_2_ + auVar241._14_2_ + auVar242._14_2_ + auVar231._14_2_;
        auVar231 = pmaddubsw(auVar117,auVar11);
        auVar241 = pmaddubsw(auVar22,auVar12);
        auVar242 = pmaddubsw(auVar196,auVar13);
        uVar2 = *(ulong *)(pu1_src + (long)(src_strd * 7) + uVar6);
        auVar187._8_6_ = 0;
        auVar187._0_8_ = uVar3;
        auVar187[0xe] = uVar48;
        auVar187[0xf] = (char)(uVar2 >> 0x38);
        auVar186._14_2_ = auVar187._14_2_;
        auVar186._8_5_ = 0;
        auVar186._0_8_ = uVar3;
        auVar186[0xd] = (char)(uVar2 >> 0x30);
        auVar185._13_3_ = auVar186._13_3_;
        auVar185._8_4_ = 0;
        auVar185._0_8_ = uVar3;
        auVar185[0xc] = uVar47;
        auVar184._12_4_ = auVar185._12_4_;
        auVar184._8_3_ = 0;
        auVar184._0_8_ = uVar3;
        auVar184[0xb] = (char)(uVar2 >> 0x28);
        auVar183._11_5_ = auVar184._11_5_;
        auVar183._8_2_ = 0;
        auVar183._0_8_ = uVar3;
        auVar183[10] = uVar46;
        auVar182._10_6_ = auVar183._10_6_;
        auVar182[8] = 0;
        auVar182._0_8_ = uVar3;
        auVar182[9] = (char)(uVar2 >> 0x20);
        auVar181._9_7_ = auVar182._9_7_;
        auVar181[8] = uVar45;
        auVar181._0_8_ = uVar3;
        auVar205._8_8_ = auVar181._8_8_;
        auVar205[7] = (char)(uVar2 >> 0x18);
        auVar205[6] = uVar44;
        auVar205[5] = (char)(uVar2 >> 0x10);
        auVar205[4] = uVar43;
        auVar205[3] = (char)(uVar2 >> 8);
        auVar205[2] = uVar42;
        auVar205[1] = (char)uVar2;
        auVar251 = pmaddubsw(auVar205,auVar10);
        pWVar1 = pWVar1 + dst_strd * 3;
        *pWVar1 = auVar251._0_2_ + auVar242._0_2_ + auVar241._0_2_ + auVar231._0_2_;
        pWVar1[1] = auVar251._2_2_ + auVar242._2_2_ + auVar241._2_2_ + auVar231._2_2_;
        pWVar1[2] = auVar251._4_2_ + auVar242._4_2_ + auVar241._4_2_ + auVar231._4_2_;
        pWVar1[3] = auVar251._6_2_ + auVar242._6_2_ + auVar241._6_2_ + auVar231._6_2_;
        pWVar1[4] = auVar251._8_2_ + auVar242._8_2_ + auVar241._8_2_ + auVar231._8_2_;
        pWVar1[5] = auVar251._10_2_ + auVar242._10_2_ + auVar241._10_2_ + auVar231._10_2_;
        pWVar1[6] = auVar251._12_2_ + auVar242._12_2_ + auVar241._12_2_ + auVar231._12_2_;
        pWVar1[7] = auVar251._14_2_ + auVar242._14_2_ + auVar241._14_2_ + auVar231._14_2_;
        if (4 < ht) {
          puVar7 = (ulong *)(pu1_src + (long)(src_strd * 8) + uVar6);
          iVar9 = 4;
          pWVar5 = local_a0;
          do {
            auVar232 = pmaddubsw(auVar232,auVar11);
            auVar241 = pmaddubsw(auVar229,auVar12);
            auVar242 = pmaddubsw(auVar230,auVar13);
            uVar3 = *puVar7;
            uVar46 = (undefined1)(uVar3 >> 0x38);
            auVar132._8_6_ = 0;
            auVar132._0_8_ = uVar2;
            auVar132[0xe] = (char)(uVar2 >> 0x38);
            auVar132[0xf] = uVar46;
            auVar131._14_2_ = auVar132._14_2_;
            auVar131._8_5_ = 0;
            auVar131._0_8_ = uVar2;
            uVar45 = (undefined1)(uVar3 >> 0x30);
            auVar131[0xd] = uVar45;
            auVar130._13_3_ = auVar131._13_3_;
            auVar130._8_4_ = 0;
            auVar130._0_8_ = uVar2;
            auVar130[0xc] = (char)(uVar2 >> 0x30);
            auVar129._12_4_ = auVar130._12_4_;
            auVar129._8_3_ = 0;
            auVar129._0_8_ = uVar2;
            uVar44 = (undefined1)(uVar3 >> 0x28);
            auVar129[0xb] = uVar44;
            auVar128._11_5_ = auVar129._11_5_;
            auVar128._8_2_ = 0;
            auVar128._0_8_ = uVar2;
            auVar128[10] = (char)(uVar2 >> 0x28);
            auVar127._10_6_ = auVar128._10_6_;
            auVar127[8] = 0;
            auVar127._0_8_ = uVar2;
            uVar43 = (undefined1)(uVar3 >> 0x20);
            auVar127[9] = uVar43;
            auVar126._9_7_ = auVar127._9_7_;
            auVar126[8] = (char)(uVar2 >> 0x20);
            auVar126._0_8_ = uVar2;
            auVar125._8_8_ = auVar126._8_8_;
            uVar42 = (undefined1)(uVar3 >> 0x18);
            auVar125[7] = uVar42;
            auVar125[6] = (char)(uVar2 >> 0x18);
            uVar79 = (undefined1)(uVar3 >> 0x10);
            auVar125[5] = uVar79;
            auVar125[4] = (char)(uVar2 >> 0x10);
            uVar48 = (undefined1)(uVar3 >> 8);
            auVar125[3] = uVar48;
            auVar125[2] = (char)(uVar2 >> 8);
            auVar125[0] = (undefined1)uVar2;
            auVar243[0] = (undefined1)uVar3;
            auVar125[1] = auVar243[0];
            auVar229 = pmaddubsw(auVar229,auVar11);
            auVar251 = pmaddubsw(auVar230,auVar12);
            auVar231 = pmaddubsw(auVar125,auVar10);
            *pWVar5 = auVar231._0_2_ + auVar242._0_2_ + auVar241._0_2_ + auVar232._0_2_;
            pWVar5[1] = auVar231._2_2_ + auVar242._2_2_ + auVar241._2_2_ + auVar232._2_2_;
            pWVar5[2] = auVar231._4_2_ + auVar242._4_2_ + auVar241._4_2_ + auVar232._4_2_;
            pWVar5[3] = auVar231._6_2_ + auVar242._6_2_ + auVar241._6_2_ + auVar232._6_2_;
            pWVar5[4] = auVar231._8_2_ + auVar242._8_2_ + auVar241._8_2_ + auVar232._8_2_;
            pWVar5[5] = auVar231._10_2_ + auVar242._10_2_ + auVar241._10_2_ + auVar232._10_2_;
            pWVar5[6] = auVar231._12_2_ + auVar242._12_2_ + auVar241._12_2_ + auVar232._12_2_;
            pWVar5[7] = auVar231._14_2_ + auVar242._14_2_ + auVar241._14_2_ + auVar232._14_2_;
            auVar231 = pmaddubsw(auVar125,auVar13);
            uVar2 = *(ulong *)((long)puVar7 + lVar8);
            auVar22 = pmaddubsw(auVar22,auVar11);
            auVar232 = pmaddubsw(auVar196,auVar12);
            uVar4 = *(ulong *)((long)puVar7 + (long)(src_strd * 2));
            uVar47 = (undefined1)(uVar2 >> 0x38);
            auVar250._8_6_ = 0;
            auVar250._0_8_ = uVar3;
            auVar250[0xe] = uVar46;
            auVar250[0xf] = uVar47;
            uVar46 = (undefined1)(uVar2 >> 0x30);
            auVar249._14_2_ = auVar250._14_2_;
            auVar249._8_5_ = 0;
            auVar249._0_8_ = uVar3;
            auVar249[0xd] = uVar46;
            auVar248._13_3_ = auVar249._13_3_;
            auVar248._8_4_ = 0;
            auVar248._0_8_ = uVar3;
            auVar248[0xc] = uVar45;
            uVar45 = (undefined1)(uVar2 >> 0x28);
            auVar247._12_4_ = auVar248._12_4_;
            auVar247._8_3_ = 0;
            auVar247._0_8_ = uVar3;
            auVar247[0xb] = uVar45;
            auVar246._11_5_ = auVar247._11_5_;
            auVar246._8_2_ = 0;
            auVar246._0_8_ = uVar3;
            auVar246[10] = uVar44;
            uVar44 = (undefined1)(uVar2 >> 0x20);
            auVar245._10_6_ = auVar246._10_6_;
            auVar245[8] = 0;
            auVar245._0_8_ = uVar3;
            auVar245[9] = uVar44;
            auVar244._9_7_ = auVar245._9_7_;
            auVar244[8] = uVar43;
            auVar244._0_8_ = uVar3;
            uVar43 = (undefined1)(uVar2 >> 0x18);
            auVar243._8_8_ = auVar244._8_8_;
            auVar243[7] = uVar43;
            auVar243[6] = uVar42;
            uVar42 = (undefined1)(uVar2 >> 0x10);
            auVar243[5] = uVar42;
            auVar243[4] = uVar79;
            uVar79 = (undefined1)(uVar2 >> 8);
            auVar243[3] = uVar79;
            auVar243[2] = uVar48;
            auVar221[0] = (undefined1)uVar2;
            auVar243[1] = auVar221[0];
            uVar48 = (undefined1)(uVar4 >> 0x38);
            auVar228._8_6_ = 0;
            auVar228._0_8_ = uVar2;
            auVar228[0xe] = uVar47;
            auVar228[0xf] = uVar48;
            uVar47 = (undefined1)(uVar4 >> 0x30);
            auVar227._14_2_ = auVar228._14_2_;
            auVar227._8_5_ = 0;
            auVar227._0_8_ = uVar2;
            auVar227[0xd] = uVar47;
            auVar226._13_3_ = auVar227._13_3_;
            auVar226._8_4_ = 0;
            auVar226._0_8_ = uVar2;
            auVar226[0xc] = uVar46;
            uVar46 = (undefined1)(uVar4 >> 0x28);
            auVar225._12_4_ = auVar226._12_4_;
            auVar225._8_3_ = 0;
            auVar225._0_8_ = uVar2;
            auVar225[0xb] = uVar46;
            auVar224._11_5_ = auVar225._11_5_;
            auVar224._8_2_ = 0;
            auVar224._0_8_ = uVar2;
            auVar224[10] = uVar45;
            uVar45 = (undefined1)(uVar4 >> 0x20);
            auVar223._10_6_ = auVar224._10_6_;
            auVar223[8] = 0;
            auVar223._0_8_ = uVar2;
            auVar223[9] = uVar45;
            auVar222._9_7_ = auVar223._9_7_;
            auVar222[8] = uVar44;
            auVar222._0_8_ = uVar2;
            uVar44 = (undefined1)(uVar4 >> 0x18);
            auVar221._8_8_ = auVar222._8_8_;
            auVar221[7] = uVar44;
            auVar221[6] = uVar43;
            uVar43 = (undefined1)(uVar4 >> 0x10);
            auVar221[5] = uVar43;
            auVar221[4] = uVar42;
            uVar42 = (undefined1)(uVar4 >> 8);
            auVar221[3] = uVar42;
            auVar221[2] = uVar79;
            auVar188[0] = (undefined1)uVar4;
            auVar221[1] = auVar188[0];
            auVar241 = pmaddubsw(auVar221,auVar10);
            pWVar1 = pWVar5 + dst_strd * 2;
            *pWVar1 = auVar241._0_2_ + auVar231._0_2_ + auVar251._0_2_ + auVar229._0_2_;
            pWVar1[1] = auVar241._2_2_ + auVar231._2_2_ + auVar251._2_2_ + auVar229._2_2_;
            pWVar1[2] = auVar241._4_2_ + auVar231._4_2_ + auVar251._4_2_ + auVar229._4_2_;
            pWVar1[3] = auVar241._6_2_ + auVar231._6_2_ + auVar251._6_2_ + auVar229._6_2_;
            pWVar1[4] = auVar241._8_2_ + auVar231._8_2_ + auVar251._8_2_ + auVar229._8_2_;
            pWVar1[5] = auVar241._10_2_ + auVar231._10_2_ + auVar251._10_2_ + auVar229._10_2_;
            pWVar1[6] = auVar241._12_2_ + auVar231._12_2_ + auVar251._12_2_ + auVar229._12_2_;
            pWVar1[7] = auVar241._14_2_ + auVar231._14_2_ + auVar251._14_2_ + auVar229._14_2_;
            auVar229 = pmaddubsw(auVar205,auVar13);
            auVar196 = pmaddubsw(auVar196,auVar11);
            auVar231 = pmaddubsw(auVar205,auVar12);
            auVar241 = pmaddubsw(auVar243,auVar10);
            pWVar1 = pWVar5 + dst_strd;
            *pWVar1 = auVar241._0_2_ + auVar229._0_2_ + auVar232._0_2_ + auVar22._0_2_;
            pWVar1[1] = auVar241._2_2_ + auVar229._2_2_ + auVar232._2_2_ + auVar22._2_2_;
            pWVar1[2] = auVar241._4_2_ + auVar229._4_2_ + auVar232._4_2_ + auVar22._4_2_;
            pWVar1[3] = auVar241._6_2_ + auVar229._6_2_ + auVar232._6_2_ + auVar22._6_2_;
            pWVar1[4] = auVar241._8_2_ + auVar229._8_2_ + auVar232._8_2_ + auVar22._8_2_;
            pWVar1[5] = auVar241._10_2_ + auVar229._10_2_ + auVar232._10_2_ + auVar22._10_2_;
            pWVar1[6] = auVar241._12_2_ + auVar229._12_2_ + auVar232._12_2_ + auVar22._12_2_;
            pWVar1[7] = auVar241._14_2_ + auVar229._14_2_ + auVar232._14_2_ + auVar22._14_2_;
            uVar2 = *(ulong *)((long)puVar7 + (long)(src_strd * 3));
            puVar7 = (ulong *)((long)puVar7 + (long)(src_strd * 4));
            auVar22 = pmaddubsw(auVar243,auVar13);
            auVar195._8_6_ = 0;
            auVar195._0_8_ = uVar4;
            auVar195[0xe] = uVar48;
            auVar195[0xf] = (char)(uVar2 >> 0x38);
            auVar194._14_2_ = auVar195._14_2_;
            auVar194._8_5_ = 0;
            auVar194._0_8_ = uVar4;
            auVar194[0xd] = (char)(uVar2 >> 0x30);
            auVar193._13_3_ = auVar194._13_3_;
            auVar193._8_4_ = 0;
            auVar193._0_8_ = uVar4;
            auVar193[0xc] = uVar47;
            auVar192._12_4_ = auVar193._12_4_;
            auVar192._8_3_ = 0;
            auVar192._0_8_ = uVar4;
            auVar192[0xb] = (char)(uVar2 >> 0x28);
            auVar191._11_5_ = auVar192._11_5_;
            auVar191._8_2_ = 0;
            auVar191._0_8_ = uVar4;
            auVar191[10] = uVar46;
            auVar190._10_6_ = auVar191._10_6_;
            auVar190[8] = 0;
            auVar190._0_8_ = uVar4;
            auVar190[9] = (char)(uVar2 >> 0x20);
            auVar189._9_7_ = auVar190._9_7_;
            auVar189[8] = uVar45;
            auVar189._0_8_ = uVar4;
            auVar188._8_8_ = auVar189._8_8_;
            auVar188[7] = (char)(uVar2 >> 0x18);
            auVar188[6] = uVar44;
            auVar188[5] = (char)(uVar2 >> 0x10);
            auVar188[4] = uVar43;
            auVar188[3] = (char)(uVar2 >> 8);
            auVar188[2] = uVar42;
            auVar188[1] = (char)uVar2;
            auVar229 = pmaddubsw(auVar188,auVar10);
            pWVar1 = pWVar5 + dst_strd * 3;
            *pWVar1 = auVar229._0_2_ + auVar22._0_2_ + auVar231._0_2_ + auVar196._0_2_;
            pWVar1[1] = auVar229._2_2_ + auVar22._2_2_ + auVar231._2_2_ + auVar196._2_2_;
            pWVar1[2] = auVar229._4_2_ + auVar22._4_2_ + auVar231._4_2_ + auVar196._4_2_;
            pWVar1[3] = auVar229._6_2_ + auVar22._6_2_ + auVar231._6_2_ + auVar196._6_2_;
            pWVar1[4] = auVar229._8_2_ + auVar22._8_2_ + auVar231._8_2_ + auVar196._8_2_;
            pWVar1[5] = auVar229._10_2_ + auVar22._10_2_ + auVar231._10_2_ + auVar196._10_2_;
            pWVar1[6] = auVar229._12_2_ + auVar22._12_2_ + auVar231._12_2_ + auVar196._12_2_;
            pWVar1[7] = auVar229._14_2_ + auVar22._14_2_ + auVar231._14_2_ + auVar196._14_2_;
            iVar9 = iVar9 + 4;
            pWVar5 = pWVar5 + (dst_strd << 2);
            auVar22 = auVar205;
            auVar196 = auVar243;
            auVar229 = auVar125;
            auVar232 = auVar230;
            auVar205 = auVar188;
            auVar230 = auVar221;
          } while (iVar9 < ht);
        }
        uVar6 = uVar6 + 8;
        local_a0 = local_a0 + 8;
      } while (uVar6 < (uint)wd);
    }
  }
  else if (0 < wd) {
    lVar8 = (long)src_strd;
    local_a0 = pi2_dst + dst_strd * 4;
    uVar6 = 0;
    do {
      pWVar5 = pi2_dst + uVar6;
      uVar2 = *(ulong *)(pu1_src + lVar8 * -3 + uVar6);
      uVar3 = *(ulong *)(pu1_src + lVar8 * -2 + uVar6);
      uVar47 = (undefined1)(uVar3 >> 0x38);
      auVar21._8_6_ = 0;
      auVar21._0_8_ = uVar2;
      auVar21[0xe] = (char)(uVar2 >> 0x38);
      auVar21[0xf] = uVar47;
      auVar20._14_2_ = auVar21._14_2_;
      auVar20._8_5_ = 0;
      auVar20._0_8_ = uVar2;
      uVar46 = (undefined1)(uVar3 >> 0x30);
      auVar20[0xd] = uVar46;
      auVar19._13_3_ = auVar20._13_3_;
      auVar19._8_4_ = 0;
      auVar19._0_8_ = uVar2;
      auVar19[0xc] = (char)(uVar2 >> 0x30);
      auVar18._12_4_ = auVar19._12_4_;
      auVar18._8_3_ = 0;
      auVar18._0_8_ = uVar2;
      uVar45 = (undefined1)(uVar3 >> 0x28);
      auVar18[0xb] = uVar45;
      auVar17._11_5_ = auVar18._11_5_;
      auVar17._8_2_ = 0;
      auVar17._0_8_ = uVar2;
      auVar17[10] = (char)(uVar2 >> 0x28);
      auVar16._10_6_ = auVar17._10_6_;
      auVar16[8] = 0;
      auVar16._0_8_ = uVar2;
      uVar44 = (undefined1)(uVar3 >> 0x20);
      auVar16[9] = uVar44;
      auVar15._9_7_ = auVar16._9_7_;
      auVar15[8] = (char)(uVar2 >> 0x20);
      auVar15._0_8_ = uVar2;
      auVar14._8_8_ = auVar15._8_8_;
      uVar43 = (undefined1)(uVar3 >> 0x18);
      auVar14[7] = uVar43;
      auVar14[6] = (char)(uVar2 >> 0x18);
      uVar42 = (undefined1)(uVar3 >> 0x10);
      auVar14[5] = uVar42;
      auVar14[4] = (char)(uVar2 >> 0x10);
      uVar79 = (undefined1)(uVar3 >> 8);
      auVar14[3] = uVar79;
      auVar14[2] = (char)(uVar2 >> 8);
      auVar14[0] = (undefined1)uVar2;
      auVar133[0] = (undefined1)uVar3;
      auVar14[1] = auVar133[0];
      auVar22 = pmaddubsw(auVar14,auVar11);
      uVar2 = *(ulong *)(pu1_src + (uVar6 - lVar8));
      uVar4 = *(ulong *)(pu1_src + uVar6);
      uVar48 = (undefined1)(uVar2 >> 0x38);
      auVar140._8_6_ = 0;
      auVar140._0_8_ = uVar3;
      auVar140[0xe] = uVar47;
      auVar140[0xf] = uVar48;
      uVar47 = (undefined1)(uVar2 >> 0x30);
      auVar139._14_2_ = auVar140._14_2_;
      auVar139._8_5_ = 0;
      auVar139._0_8_ = uVar3;
      auVar139[0xd] = uVar47;
      auVar138._13_3_ = auVar139._13_3_;
      auVar138._8_4_ = 0;
      auVar138._0_8_ = uVar3;
      auVar138[0xc] = uVar46;
      uVar46 = (undefined1)(uVar2 >> 0x28);
      auVar137._12_4_ = auVar138._12_4_;
      auVar137._8_3_ = 0;
      auVar137._0_8_ = uVar3;
      auVar137[0xb] = uVar46;
      auVar136._11_5_ = auVar137._11_5_;
      auVar136._8_2_ = 0;
      auVar136._0_8_ = uVar3;
      auVar136[10] = uVar45;
      uVar45 = (undefined1)(uVar2 >> 0x20);
      auVar135._10_6_ = auVar136._10_6_;
      auVar135[8] = 0;
      auVar135._0_8_ = uVar3;
      auVar135[9] = uVar45;
      auVar134._9_7_ = auVar135._9_7_;
      auVar134[8] = uVar44;
      auVar134._0_8_ = uVar3;
      uVar44 = (undefined1)(uVar2 >> 0x18);
      auVar133._8_8_ = auVar134._8_8_;
      auVar133[7] = uVar44;
      auVar133[6] = uVar43;
      uVar43 = (undefined1)(uVar2 >> 0x10);
      auVar133[5] = uVar43;
      auVar133[4] = uVar42;
      uVar42 = (undefined1)(uVar2 >> 8);
      auVar133[3] = uVar42;
      auVar133[2] = uVar79;
      auVar133[1] = (char)uVar2;
      uVar84 = (undefined1)(uVar4 >> 0x38);
      auVar156._8_6_ = 0;
      auVar156._0_8_ = uVar2;
      auVar156[0xe] = uVar48;
      auVar156[0xf] = uVar84;
      uVar83 = (undefined1)(uVar4 >> 0x30);
      auVar155._14_2_ = auVar156._14_2_;
      auVar155._8_5_ = 0;
      auVar155._0_8_ = uVar2;
      auVar155[0xd] = uVar83;
      auVar154._13_3_ = auVar155._13_3_;
      auVar154._8_4_ = 0;
      auVar154._0_8_ = uVar2;
      auVar154[0xc] = uVar47;
      uVar82 = (undefined1)(uVar4 >> 0x28);
      auVar153._12_4_ = auVar154._12_4_;
      auVar153._8_3_ = 0;
      auVar153._0_8_ = uVar2;
      auVar153[0xb] = uVar82;
      auVar152._11_5_ = auVar153._11_5_;
      auVar152._8_2_ = 0;
      auVar152._0_8_ = uVar2;
      auVar152[10] = uVar46;
      uVar81 = (undefined1)(uVar4 >> 0x20);
      auVar151._10_6_ = auVar152._10_6_;
      auVar151[8] = 0;
      auVar151._0_8_ = uVar2;
      auVar151[9] = uVar81;
      auVar150._9_7_ = auVar151._9_7_;
      auVar150[8] = uVar45;
      auVar150._0_8_ = uVar2;
      uVar80 = (undefined1)(uVar4 >> 0x18);
      auVar149._8_8_ = auVar150._8_8_;
      auVar149[7] = uVar80;
      auVar149[6] = uVar44;
      uVar79 = (undefined1)(uVar4 >> 0x10);
      auVar149[5] = uVar79;
      auVar149[4] = uVar43;
      uVar48 = (undefined1)(uVar4 >> 8);
      auVar149[3] = uVar48;
      auVar149[2] = uVar42;
      auVar101[0] = (undefined1)uVar4;
      auVar149[1] = auVar101[0];
      auVar149[0] = (char)uVar2;
      auVar196 = pmaddubsw(auVar149,auVar12);
      uVar2 = *(ulong *)(pu1_src + lVar8 + uVar6);
      uVar3 = *(ulong *)(pu1_src + (long)(src_strd * 2) + uVar6);
      uVar47 = (undefined1)(uVar2 >> 0x38);
      auVar108._8_6_ = 0;
      auVar108._0_8_ = uVar4;
      auVar108[0xe] = uVar84;
      auVar108[0xf] = uVar47;
      uVar46 = (undefined1)(uVar2 >> 0x30);
      auVar107._14_2_ = auVar108._14_2_;
      auVar107._8_5_ = 0;
      auVar107._0_8_ = uVar4;
      auVar107[0xd] = uVar46;
      auVar106._13_3_ = auVar107._13_3_;
      auVar106._8_4_ = 0;
      auVar106._0_8_ = uVar4;
      auVar106[0xc] = uVar83;
      uVar45 = (undefined1)(uVar2 >> 0x28);
      auVar105._12_4_ = auVar106._12_4_;
      auVar105._8_3_ = 0;
      auVar105._0_8_ = uVar4;
      auVar105[0xb] = uVar45;
      auVar104._11_5_ = auVar105._11_5_;
      auVar104._8_2_ = 0;
      auVar104._0_8_ = uVar4;
      auVar104[10] = uVar82;
      uVar44 = (undefined1)(uVar2 >> 0x20);
      auVar103._10_6_ = auVar104._10_6_;
      auVar103[8] = 0;
      auVar103._0_8_ = uVar4;
      auVar103[9] = uVar44;
      auVar102._9_7_ = auVar103._9_7_;
      auVar102[8] = uVar81;
      auVar102._0_8_ = uVar4;
      uVar43 = (undefined1)(uVar2 >> 0x18);
      auVar101._8_8_ = auVar102._8_8_;
      auVar101[7] = uVar43;
      auVar101[6] = uVar80;
      uVar42 = (undefined1)(uVar2 >> 0x10);
      auVar101[5] = uVar42;
      auVar101[4] = uVar79;
      uVar79 = (undefined1)(uVar2 >> 8);
      auVar101[3] = uVar79;
      auVar101[2] = uVar48;
      auVar86[0] = (undefined1)uVar2;
      auVar101[1] = auVar86[0];
      uVar48 = (undefined1)(uVar3 >> 0x38);
      auVar93._8_6_ = 0;
      auVar93._0_8_ = uVar2;
      auVar93[0xe] = uVar47;
      auVar93[0xf] = uVar48;
      uVar47 = (undefined1)(uVar3 >> 0x30);
      auVar92._14_2_ = auVar93._14_2_;
      auVar92._8_5_ = 0;
      auVar92._0_8_ = uVar2;
      auVar92[0xd] = uVar47;
      auVar91._13_3_ = auVar92._13_3_;
      auVar91._8_4_ = 0;
      auVar91._0_8_ = uVar2;
      auVar91[0xc] = uVar46;
      uVar46 = (undefined1)(uVar3 >> 0x28);
      auVar90._12_4_ = auVar91._12_4_;
      auVar90._8_3_ = 0;
      auVar90._0_8_ = uVar2;
      auVar90[0xb] = uVar46;
      auVar89._11_5_ = auVar90._11_5_;
      auVar89._8_2_ = 0;
      auVar89._0_8_ = uVar2;
      auVar89[10] = uVar45;
      uVar45 = (undefined1)(uVar3 >> 0x20);
      auVar88._10_6_ = auVar89._10_6_;
      auVar88[8] = 0;
      auVar88._0_8_ = uVar2;
      auVar88[9] = uVar45;
      auVar87._9_7_ = auVar88._9_7_;
      auVar87[8] = uVar44;
      auVar87._0_8_ = uVar2;
      uVar44 = (undefined1)(uVar3 >> 0x18);
      auVar86._8_8_ = auVar87._8_8_;
      auVar86[7] = uVar44;
      auVar86[6] = uVar43;
      uVar43 = (undefined1)(uVar3 >> 0x10);
      auVar86[5] = uVar43;
      auVar86[4] = uVar42;
      uVar42 = (undefined1)(uVar3 >> 8);
      auVar86[3] = uVar42;
      auVar86[2] = uVar79;
      auVar23[0] = (undefined1)uVar3;
      auVar86[1] = auVar23[0];
      auVar229 = pmaddubsw(auVar86,auVar13);
      uVar2 = *(ulong *)(pu1_src + (long)(src_strd * 3) + uVar6);
      uVar4 = *(ulong *)(pu1_src + (long)(src_strd * 4) + uVar6);
      uVar85 = (undefined1)(uVar2 >> 0x38);
      auVar30._8_6_ = 0;
      auVar30._0_8_ = uVar3;
      auVar30[0xe] = uVar48;
      auVar30[0xf] = uVar85;
      auVar29._14_2_ = auVar30._14_2_;
      auVar29._8_5_ = 0;
      auVar29._0_8_ = uVar3;
      uVar84 = (undefined1)(uVar2 >> 0x30);
      auVar29[0xd] = uVar84;
      auVar28._13_3_ = auVar29._13_3_;
      auVar28._8_4_ = 0;
      auVar28._0_8_ = uVar3;
      auVar28[0xc] = uVar47;
      auVar27._12_4_ = auVar28._12_4_;
      auVar27._8_3_ = 0;
      auVar27._0_8_ = uVar3;
      uVar83 = (undefined1)(uVar2 >> 0x28);
      auVar27[0xb] = uVar83;
      auVar26._11_5_ = auVar27._11_5_;
      auVar26._8_2_ = 0;
      auVar26._0_8_ = uVar3;
      auVar26[10] = uVar46;
      auVar25._10_6_ = auVar26._10_6_;
      auVar25[8] = 0;
      auVar25._0_8_ = uVar3;
      uVar82 = (undefined1)(uVar2 >> 0x20);
      auVar25[9] = uVar82;
      auVar24._9_7_ = auVar25._9_7_;
      auVar24[8] = uVar45;
      auVar24._0_8_ = uVar3;
      auVar23._8_8_ = auVar24._8_8_;
      uVar81 = (undefined1)(uVar2 >> 0x18);
      auVar23[7] = uVar81;
      auVar23[6] = uVar44;
      uVar80 = (undefined1)(uVar2 >> 0x10);
      auVar23[5] = uVar80;
      auVar23[4] = uVar43;
      uVar79 = (undefined1)(uVar2 >> 8);
      auVar23[3] = uVar79;
      auVar23[2] = uVar42;
      auVar64[0] = (undefined1)uVar2;
      auVar23[1] = auVar64[0];
      uVar48 = (undefined1)(uVar4 >> 0x38);
      auVar71._8_6_ = 0;
      auVar71._0_8_ = uVar2;
      auVar71[0xe] = uVar85;
      auVar71[0xf] = uVar48;
      uVar47 = (undefined1)(uVar4 >> 0x30);
      auVar70._14_2_ = auVar71._14_2_;
      auVar70._8_5_ = 0;
      auVar70._0_8_ = uVar2;
      auVar70[0xd] = uVar47;
      auVar69._13_3_ = auVar70._13_3_;
      auVar69._8_4_ = 0;
      auVar69._0_8_ = uVar2;
      auVar69[0xc] = uVar84;
      uVar46 = (undefined1)(uVar4 >> 0x28);
      auVar68._12_4_ = auVar69._12_4_;
      auVar68._8_3_ = 0;
      auVar68._0_8_ = uVar2;
      auVar68[0xb] = uVar46;
      auVar67._11_5_ = auVar68._11_5_;
      auVar67._8_2_ = 0;
      auVar67._0_8_ = uVar2;
      auVar67[10] = uVar83;
      uVar45 = (undefined1)(uVar4 >> 0x20);
      auVar66._10_6_ = auVar67._10_6_;
      auVar66[8] = 0;
      auVar66._0_8_ = uVar2;
      auVar66[9] = uVar45;
      auVar65._9_7_ = auVar66._9_7_;
      auVar65[8] = uVar82;
      auVar65._0_8_ = uVar2;
      uVar44 = (undefined1)(uVar4 >> 0x18);
      auVar64._8_8_ = auVar65._8_8_;
      auVar64[7] = uVar44;
      auVar64[6] = uVar81;
      uVar43 = (undefined1)(uVar4 >> 0x10);
      auVar64[5] = uVar43;
      auVar64[4] = uVar80;
      uVar42 = (undefined1)(uVar4 >> 8);
      auVar64[3] = uVar42;
      auVar64[2] = uVar79;
      auVar49[0] = (undefined1)uVar4;
      auVar64[1] = auVar49[0];
      auVar232 = pmaddubsw(auVar64,auVar10);
      *(ulong *)pWVar5 =
           CONCAT26(auVar232._6_2_ + auVar229._6_2_ + auVar196._6_2_ + auVar22._6_2_,
                    CONCAT24(auVar232._4_2_ + auVar229._4_2_ + auVar196._4_2_ + auVar22._4_2_,
                             CONCAT22(auVar232._2_2_ + auVar229._2_2_ +
                                      auVar196._2_2_ + auVar22._2_2_,
                                      auVar232._0_2_ + auVar229._0_2_ +
                                      auVar196._0_2_ + auVar22._0_2_)));
      auVar22 = pmaddubsw(auVar149,auVar11);
      auVar196 = pmaddubsw(auVar86,auVar12);
      auVar229 = pmaddubsw(auVar64,auVar13);
      uVar2 = *(ulong *)(pu1_src + (long)(src_strd * 5) + uVar6);
      uVar3 = *(ulong *)(pu1_src + (long)(src_strd * 6) + uVar6);
      uVar85 = (undefined1)(uVar2 >> 0x38);
      auVar56._8_6_ = 0;
      auVar56._0_8_ = uVar4;
      auVar56[0xe] = uVar48;
      auVar56[0xf] = uVar85;
      auVar55._14_2_ = auVar56._14_2_;
      auVar55._8_5_ = 0;
      auVar55._0_8_ = uVar4;
      uVar84 = (undefined1)(uVar2 >> 0x30);
      auVar55[0xd] = uVar84;
      auVar54._13_3_ = auVar55._13_3_;
      auVar54._8_4_ = 0;
      auVar54._0_8_ = uVar4;
      auVar54[0xc] = uVar47;
      auVar53._12_4_ = auVar54._12_4_;
      auVar53._8_3_ = 0;
      auVar53._0_8_ = uVar4;
      uVar83 = (undefined1)(uVar2 >> 0x28);
      auVar53[0xb] = uVar83;
      auVar52._11_5_ = auVar53._11_5_;
      auVar52._8_2_ = 0;
      auVar52._0_8_ = uVar4;
      auVar52[10] = uVar46;
      auVar51._10_6_ = auVar52._10_6_;
      auVar51[8] = 0;
      auVar51._0_8_ = uVar4;
      uVar82 = (undefined1)(uVar2 >> 0x20);
      auVar51[9] = uVar82;
      auVar50._9_7_ = auVar51._9_7_;
      auVar50[8] = uVar45;
      auVar50._0_8_ = uVar4;
      auVar49._8_8_ = auVar50._8_8_;
      uVar81 = (undefined1)(uVar2 >> 0x18);
      auVar49[7] = uVar81;
      auVar49[6] = uVar44;
      uVar80 = (undefined1)(uVar2 >> 0x10);
      auVar49[5] = uVar80;
      auVar49[4] = uVar43;
      uVar79 = (undefined1)(uVar2 >> 8);
      auVar49[3] = uVar79;
      auVar49[2] = uVar42;
      auVar197[0] = (undefined1)uVar2;
      auVar49[1] = auVar197[0];
      uVar48 = (undefined1)(uVar3 >> 0x38);
      auVar204._8_6_ = 0;
      auVar204._0_8_ = uVar2;
      auVar204[0xe] = uVar85;
      auVar204[0xf] = uVar48;
      uVar47 = (undefined1)(uVar3 >> 0x30);
      auVar203._14_2_ = auVar204._14_2_;
      auVar203._8_5_ = 0;
      auVar203._0_8_ = uVar2;
      auVar203[0xd] = uVar47;
      auVar202._13_3_ = auVar203._13_3_;
      auVar202._8_4_ = 0;
      auVar202._0_8_ = uVar2;
      auVar202[0xc] = uVar84;
      uVar46 = (undefined1)(uVar3 >> 0x28);
      auVar201._12_4_ = auVar202._12_4_;
      auVar201._8_3_ = 0;
      auVar201._0_8_ = uVar2;
      auVar201[0xb] = uVar46;
      auVar200._11_5_ = auVar201._11_5_;
      auVar200._8_2_ = 0;
      auVar200._0_8_ = uVar2;
      auVar200[10] = uVar83;
      uVar45 = (undefined1)(uVar3 >> 0x20);
      auVar199._10_6_ = auVar200._10_6_;
      auVar199[8] = 0;
      auVar199._0_8_ = uVar2;
      auVar199[9] = uVar45;
      auVar198._9_7_ = auVar199._9_7_;
      auVar198[8] = uVar82;
      auVar198._0_8_ = uVar2;
      uVar44 = (undefined1)(uVar3 >> 0x18);
      auVar197._8_8_ = auVar198._8_8_;
      auVar197[7] = uVar44;
      auVar197[6] = uVar81;
      uVar43 = (undefined1)(uVar3 >> 0x10);
      auVar197[5] = uVar43;
      auVar197[4] = uVar80;
      uVar42 = (undefined1)(uVar3 >> 8);
      auVar197[3] = uVar42;
      auVar197[2] = uVar79;
      auVar157[0] = (undefined1)uVar3;
      auVar197[1] = auVar157[0];
      auVar232 = pmaddubsw(auVar197,auVar10);
      *(ulong *)(pWVar5 + dst_strd * 2) =
           CONCAT26(auVar232._6_2_ + auVar229._6_2_ + auVar196._6_2_ + auVar22._6_2_,
                    CONCAT24(auVar232._4_2_ + auVar229._4_2_ + auVar196._4_2_ + auVar22._4_2_,
                             CONCAT22(auVar232._2_2_ + auVar229._2_2_ +
                                      auVar196._2_2_ + auVar22._2_2_,
                                      auVar232._0_2_ + auVar229._0_2_ +
                                      auVar196._0_2_ + auVar22._0_2_)));
      auVar22 = pmaddubsw(auVar133,auVar11);
      auVar229 = pmaddubsw(auVar101,auVar12);
      auVar196 = pmaddubsw(auVar23,auVar13);
      auVar232 = pmaddubsw(auVar49,auVar10);
      *(ulong *)(pWVar5 + dst_strd) =
           CONCAT26(auVar232._6_2_ + auVar196._6_2_ + auVar229._6_2_ + auVar22._6_2_,
                    CONCAT24(auVar232._4_2_ + auVar196._4_2_ + auVar229._4_2_ + auVar22._4_2_,
                             CONCAT22(auVar232._2_2_ + auVar196._2_2_ +
                                      auVar229._2_2_ + auVar22._2_2_,
                                      auVar232._0_2_ + auVar196._0_2_ +
                                      auVar229._0_2_ + auVar22._0_2_)));
      auVar22 = pmaddubsw(auVar101,auVar11);
      auVar196 = pmaddubsw(auVar23,auVar12);
      auVar229 = pmaddubsw(auVar49,auVar13);
      uVar2 = *(ulong *)(pu1_src + (long)(src_strd * 7) + uVar6);
      auVar164._8_6_ = 0;
      auVar164._0_8_ = uVar3;
      auVar164[0xe] = uVar48;
      auVar164[0xf] = (char)(uVar2 >> 0x38);
      auVar163._14_2_ = auVar164._14_2_;
      auVar163._8_5_ = 0;
      auVar163._0_8_ = uVar3;
      auVar163[0xd] = (char)(uVar2 >> 0x30);
      auVar162._13_3_ = auVar163._13_3_;
      auVar162._8_4_ = 0;
      auVar162._0_8_ = uVar3;
      auVar162[0xc] = uVar47;
      auVar161._12_4_ = auVar162._12_4_;
      auVar161._8_3_ = 0;
      auVar161._0_8_ = uVar3;
      auVar161[0xb] = (char)(uVar2 >> 0x28);
      auVar160._11_5_ = auVar161._11_5_;
      auVar160._8_2_ = 0;
      auVar160._0_8_ = uVar3;
      auVar160[10] = uVar46;
      auVar159._10_6_ = auVar160._10_6_;
      auVar159[8] = 0;
      auVar159._0_8_ = uVar3;
      auVar159[9] = (char)(uVar2 >> 0x20);
      auVar158._9_7_ = auVar159._9_7_;
      auVar158[8] = uVar45;
      auVar158._0_8_ = uVar3;
      auVar157._8_8_ = auVar158._8_8_;
      auVar157[7] = (char)(uVar2 >> 0x18);
      auVar157[6] = uVar44;
      auVar157[5] = (char)(uVar2 >> 0x10);
      auVar157[4] = uVar43;
      auVar157[3] = (char)(uVar2 >> 8);
      auVar157[2] = uVar42;
      auVar157[1] = (char)uVar2;
      auVar232 = pmaddubsw(auVar157,auVar10);
      *(ulong *)(pWVar5 + dst_strd * 3) =
           CONCAT26(auVar232._6_2_ + auVar229._6_2_ + auVar196._6_2_ + auVar22._6_2_,
                    CONCAT24(auVar232._4_2_ + auVar229._4_2_ + auVar196._4_2_ + auVar22._4_2_,
                             CONCAT22(auVar232._2_2_ + auVar229._2_2_ +
                                      auVar196._2_2_ + auVar22._2_2_,
                                      auVar232._0_2_ + auVar229._0_2_ +
                                      auVar196._0_2_ + auVar22._0_2_)));
      if (4 < ht) {
        puVar7 = (ulong *)(pu1_src + (long)(src_strd * 8) + uVar6);
        iVar9 = 4;
        pWVar5 = local_a0;
        do {
          auVar22 = pmaddubsw(auVar86,auVar11);
          auVar232 = pmaddubsw(auVar64,auVar12);
          auVar205 = pmaddubsw(auVar197,auVar13);
          uVar3 = *puVar7;
          uVar46 = (undefined1)(uVar3 >> 0x38);
          auVar116._8_6_ = 0;
          auVar116._0_8_ = uVar2;
          auVar116[0xe] = (char)(uVar2 >> 0x38);
          auVar116[0xf] = uVar46;
          auVar115._14_2_ = auVar116._14_2_;
          auVar115._8_5_ = 0;
          auVar115._0_8_ = uVar2;
          uVar45 = (undefined1)(uVar3 >> 0x30);
          auVar115[0xd] = uVar45;
          auVar114._13_3_ = auVar115._13_3_;
          auVar114._8_4_ = 0;
          auVar114._0_8_ = uVar2;
          auVar114[0xc] = (char)(uVar2 >> 0x30);
          auVar113._12_4_ = auVar114._12_4_;
          auVar113._8_3_ = 0;
          auVar113._0_8_ = uVar2;
          uVar44 = (undefined1)(uVar3 >> 0x28);
          auVar113[0xb] = uVar44;
          auVar112._11_5_ = auVar113._11_5_;
          auVar112._8_2_ = 0;
          auVar112._0_8_ = uVar2;
          auVar112[10] = (char)(uVar2 >> 0x28);
          auVar111._10_6_ = auVar112._10_6_;
          auVar111[8] = 0;
          auVar111._0_8_ = uVar2;
          uVar43 = (undefined1)(uVar3 >> 0x20);
          auVar111[9] = uVar43;
          auVar110._9_7_ = auVar111._9_7_;
          auVar110[8] = (char)(uVar2 >> 0x20);
          auVar110._0_8_ = uVar2;
          auVar109._8_8_ = auVar110._8_8_;
          uVar42 = (undefined1)(uVar3 >> 0x18);
          auVar109[7] = uVar42;
          auVar109[6] = (char)(uVar2 >> 0x18);
          uVar79 = (undefined1)(uVar3 >> 0x10);
          auVar109[5] = uVar79;
          auVar109[4] = (char)(uVar2 >> 0x10);
          uVar48 = (undefined1)(uVar3 >> 8);
          auVar109[3] = uVar48;
          auVar109[2] = (char)(uVar2 >> 8);
          auVar109[0] = (undefined1)uVar2;
          auVar233[0] = (undefined1)uVar3;
          auVar109[1] = auVar233[0];
          auVar196 = pmaddubsw(auVar64,auVar11);
          auVar230 = pmaddubsw(auVar197,auVar12);
          auVar229 = pmaddubsw(auVar109,auVar10);
          *(ulong *)pWVar5 =
               CONCAT26(auVar229._6_2_ + auVar205._6_2_ + auVar232._6_2_ + auVar22._6_2_,
                        CONCAT24(auVar229._4_2_ + auVar205._4_2_ + auVar232._4_2_ + auVar22._4_2_,
                                 CONCAT22(auVar229._2_2_ +
                                          auVar205._2_2_ + auVar232._2_2_ + auVar22._2_2_,
                                          auVar229._0_2_ +
                                          auVar205._0_2_ + auVar232._0_2_ + auVar22._0_2_)));
          auVar232 = pmaddubsw(auVar109,auVar13);
          uVar2 = *(ulong *)((long)puVar7 + lVar8);
          auVar22 = pmaddubsw(auVar23,auVar11);
          auVar229 = pmaddubsw(auVar49,auVar12);
          uVar4 = *(ulong *)((long)puVar7 + (long)(src_strd * 2));
          uVar47 = (undefined1)(uVar2 >> 0x38);
          auVar240._8_6_ = 0;
          auVar240._0_8_ = uVar3;
          auVar240[0xe] = uVar46;
          auVar240[0xf] = uVar47;
          uVar46 = (undefined1)(uVar2 >> 0x30);
          auVar239._14_2_ = auVar240._14_2_;
          auVar239._8_5_ = 0;
          auVar239._0_8_ = uVar3;
          auVar239[0xd] = uVar46;
          auVar238._13_3_ = auVar239._13_3_;
          auVar238._8_4_ = 0;
          auVar238._0_8_ = uVar3;
          auVar238[0xc] = uVar45;
          uVar45 = (undefined1)(uVar2 >> 0x28);
          auVar237._12_4_ = auVar238._12_4_;
          auVar237._8_3_ = 0;
          auVar237._0_8_ = uVar3;
          auVar237[0xb] = uVar45;
          auVar236._11_5_ = auVar237._11_5_;
          auVar236._8_2_ = 0;
          auVar236._0_8_ = uVar3;
          auVar236[10] = uVar44;
          uVar44 = (undefined1)(uVar2 >> 0x20);
          auVar235._10_6_ = auVar236._10_6_;
          auVar235[8] = 0;
          auVar235._0_8_ = uVar3;
          auVar235[9] = uVar44;
          auVar234._9_7_ = auVar235._9_7_;
          auVar234[8] = uVar43;
          auVar234._0_8_ = uVar3;
          uVar43 = (undefined1)(uVar2 >> 0x18);
          auVar233._8_8_ = auVar234._8_8_;
          auVar233[7] = uVar43;
          auVar233[6] = uVar42;
          uVar42 = (undefined1)(uVar2 >> 0x10);
          auVar233[5] = uVar42;
          auVar233[4] = uVar79;
          uVar79 = (undefined1)(uVar2 >> 8);
          auVar233[3] = uVar79;
          auVar233[2] = uVar48;
          auVar206[0] = (undefined1)uVar2;
          auVar233[1] = auVar206[0];
          uVar48 = (undefined1)(uVar4 >> 0x38);
          auVar213._8_6_ = 0;
          auVar213._0_8_ = uVar2;
          auVar213[0xe] = uVar47;
          auVar213[0xf] = uVar48;
          uVar47 = (undefined1)(uVar4 >> 0x30);
          auVar212._14_2_ = auVar213._14_2_;
          auVar212._8_5_ = 0;
          auVar212._0_8_ = uVar2;
          auVar212[0xd] = uVar47;
          auVar211._13_3_ = auVar212._13_3_;
          auVar211._8_4_ = 0;
          auVar211._0_8_ = uVar2;
          auVar211[0xc] = uVar46;
          uVar46 = (undefined1)(uVar4 >> 0x28);
          auVar210._12_4_ = auVar211._12_4_;
          auVar210._8_3_ = 0;
          auVar210._0_8_ = uVar2;
          auVar210[0xb] = uVar46;
          auVar209._11_5_ = auVar210._11_5_;
          auVar209._8_2_ = 0;
          auVar209._0_8_ = uVar2;
          auVar209[10] = uVar45;
          uVar45 = (undefined1)(uVar4 >> 0x20);
          auVar208._10_6_ = auVar209._10_6_;
          auVar208[8] = 0;
          auVar208._0_8_ = uVar2;
          auVar208[9] = uVar45;
          auVar207._9_7_ = auVar208._9_7_;
          auVar207[8] = uVar44;
          auVar207._0_8_ = uVar2;
          uVar44 = (undefined1)(uVar4 >> 0x18);
          auVar206._8_8_ = auVar207._8_8_;
          auVar206[7] = uVar44;
          auVar206[6] = uVar43;
          uVar43 = (undefined1)(uVar4 >> 0x10);
          auVar206[5] = uVar43;
          auVar206[4] = uVar42;
          uVar42 = (undefined1)(uVar4 >> 8);
          auVar206[3] = uVar42;
          auVar206[2] = uVar79;
          auVar165[0] = (undefined1)uVar4;
          auVar206[1] = auVar165[0];
          auVar205 = pmaddubsw(auVar206,auVar10);
          *(ulong *)(pWVar5 + dst_strd * 2) =
               CONCAT26(auVar205._6_2_ + auVar232._6_2_ + auVar230._6_2_ + auVar196._6_2_,
                        CONCAT24(auVar205._4_2_ + auVar232._4_2_ + auVar230._4_2_ + auVar196._4_2_,
                                 CONCAT22(auVar205._2_2_ +
                                          auVar232._2_2_ + auVar230._2_2_ + auVar196._2_2_,
                                          auVar205._0_2_ +
                                          auVar232._0_2_ + auVar230._0_2_ + auVar196._0_2_)));
          auVar232 = pmaddubsw(auVar157,auVar13);
          auVar196 = pmaddubsw(auVar49,auVar11);
          auVar205 = pmaddubsw(auVar157,auVar12);
          auVar230 = pmaddubsw(auVar233,auVar10);
          *(ulong *)(pWVar5 + dst_strd) =
               CONCAT26(auVar230._6_2_ + auVar232._6_2_ + auVar229._6_2_ + auVar22._6_2_,
                        CONCAT24(auVar230._4_2_ + auVar232._4_2_ + auVar229._4_2_ + auVar22._4_2_,
                                 CONCAT22(auVar230._2_2_ +
                                          auVar232._2_2_ + auVar229._2_2_ + auVar22._2_2_,
                                          auVar230._0_2_ +
                                          auVar232._0_2_ + auVar229._0_2_ + auVar22._0_2_)));
          uVar2 = *(ulong *)((long)puVar7 + (long)(src_strd * 3));
          puVar7 = (ulong *)((long)puVar7 + (long)(src_strd * 4));
          auVar22 = pmaddubsw(auVar233,auVar13);
          auVar172._8_6_ = 0;
          auVar172._0_8_ = uVar4;
          auVar172[0xe] = uVar48;
          auVar172[0xf] = (char)(uVar2 >> 0x38);
          auVar171._14_2_ = auVar172._14_2_;
          auVar171._8_5_ = 0;
          auVar171._0_8_ = uVar4;
          auVar171[0xd] = (char)(uVar2 >> 0x30);
          auVar170._13_3_ = auVar171._13_3_;
          auVar170._8_4_ = 0;
          auVar170._0_8_ = uVar4;
          auVar170[0xc] = uVar47;
          auVar169._12_4_ = auVar170._12_4_;
          auVar169._8_3_ = 0;
          auVar169._0_8_ = uVar4;
          auVar169[0xb] = (char)(uVar2 >> 0x28);
          auVar168._11_5_ = auVar169._11_5_;
          auVar168._8_2_ = 0;
          auVar168._0_8_ = uVar4;
          auVar168[10] = uVar46;
          auVar167._10_6_ = auVar168._10_6_;
          auVar167[8] = 0;
          auVar167._0_8_ = uVar4;
          auVar167[9] = (char)(uVar2 >> 0x20);
          auVar166._9_7_ = auVar167._9_7_;
          auVar166[8] = uVar45;
          auVar166._0_8_ = uVar4;
          auVar165._8_8_ = auVar166._8_8_;
          auVar165[7] = (char)(uVar2 >> 0x18);
          auVar165[6] = uVar44;
          auVar165[5] = (char)(uVar2 >> 0x10);
          auVar165[4] = uVar43;
          auVar165[3] = (char)(uVar2 >> 8);
          auVar165[2] = uVar42;
          auVar165[1] = (char)uVar2;
          auVar229 = pmaddubsw(auVar165,auVar10);
          *(ulong *)(pWVar5 + dst_strd * 3) =
               CONCAT26(auVar229._6_2_ + auVar22._6_2_ + auVar205._6_2_ + auVar196._6_2_,
                        CONCAT24(auVar229._4_2_ + auVar22._4_2_ + auVar205._4_2_ + auVar196._4_2_,
                                 CONCAT22(auVar229._2_2_ +
                                          auVar22._2_2_ + auVar205._2_2_ + auVar196._2_2_,
                                          auVar229._0_2_ +
                                          auVar22._0_2_ + auVar205._0_2_ + auVar196._0_2_)));
          iVar9 = iVar9 + 4;
          pWVar5 = pWVar5 + dst_strd * 4;
          auVar23 = auVar157;
          auVar49 = auVar233;
          auVar64 = auVar109;
          auVar86 = auVar197;
          auVar157 = auVar165;
          auVar197 = auVar206;
        } while (iVar9 < ht);
      }
      uVar6 = uVar6 + 4;
      local_a0 = local_a0 + 4;
    } while (uVar6 < (uint)wd);
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_vert_w16out_ssse3(UWORD8 *pu1_src,
                                             WORD16 *pi2_dst,
                                             WORD32 src_strd,
                                             WORD32 dst_strd,
                                             WORD8 *pi1_coeff,
                                             WORD32 ht,
                                             WORD32 wd)
{
    WORD32 row, col;
    UWORD8 *pu1_src_copy;
    WORD16 *pi2_dst_copy;
    __m128i coeff0_1_8x16b, coeff2_3_8x16b, coeff4_5_8x16b, coeff6_7_8x16b;
    __m128i s0_8x16b, s1_8x16b, s2_8x16b, s3_8x16b, s4_8x16b, s5_8x16b, s6_8x16b;
    __m128i s2_0_16x8b, s2_1_16x8b, s2_2_16x8b, s2_3_16x8b, s2_4_16x8b, s2_5_16x8b, s2_6_16x8b, s2_7_16x8b, s2_8_16x8b, s2_9_16x8b, s2_10_16x8b;
    __m128i s3_0_16x8b, s3_1_16x8b, s3_2_16x8b, s3_3_16x8b, s3_4_16x8b;
    __m128i s4_0_16x8b, s4_1_16x8b, s4_2_16x8b, s4_3_16x8b, s4_4_16x8b;
    __m128i s10_8x16b, s11_8x16b, s12_8x16b, s13_8x16b, s14_8x16b, s15_8x16b, s16_8x16b;
    __m128i s20_8x16b, s21_8x16b, s22_8x16b, s23_8x16b, s24_8x16b, s25_8x16b, s26_8x16b;
    __m128i s30_8x16b, s31_8x16b, s32_8x16b, s33_8x16b, s34_8x16b, s35_8x16b, s36_8x16b;


    __m128i control_mask_1_8x16b, control_mask_2_8x16b, control_mask_3_8x16b, control_mask_4_8x16b;

/* load 8 8-bit coefficients and convert 8-bit into 16-bit  */
    s4_8x16b = _mm_loadl_epi64((__m128i *)pi1_coeff);

    control_mask_1_8x16b = _mm_set1_epi32(0x01000100); /* Control Mask register */
    control_mask_2_8x16b = _mm_set1_epi32(0x03020302); /* Control Mask register */
    control_mask_3_8x16b = _mm_set1_epi32(0x05040504); /* Control Mask register */
    control_mask_4_8x16b = _mm_set1_epi32(0x07060706); /* Control Mask register */

    coeff0_1_8x16b = _mm_shuffle_epi8(s4_8x16b, control_mask_1_8x16b);  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi8(s4_8x16b, control_mask_2_8x16b);  /* pi1_coeff[4] */

    coeff4_5_8x16b = _mm_shuffle_epi8(s4_8x16b, control_mask_3_8x16b);  /* pi1_coeff[4] */
    coeff6_7_8x16b = _mm_shuffle_epi8(s4_8x16b, control_mask_4_8x16b);  /* pi1_coeff[4] */


/*  outer for loop starts from here */
    if((wd % 8) == 0)
    { /* wd = multiple of 8 case */

        pu1_src_copy = pu1_src;
        pi2_dst_copy = pi2_dst;

        for(col = 0; col < wd; col += 8)
        {

            pu1_src = pu1_src_copy + col;
            pi2_dst = pi2_dst_copy + col;

            PREFETCH((char const *)(pu1_src + (8 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (9 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (10 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (11 * src_strd)), _MM_HINT_T0)

            /*load 8 pixel values */
            s2_0_16x8b  = _mm_loadl_epi64((__m128i *)(pu1_src + (-3 * src_strd)));

            /*load 8 pixel values */
            s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (-2 * src_strd)));

            s3_0_16x8b = _mm_unpacklo_epi8(s2_0_16x8b, s2_1_16x8b);

            s0_8x16b = _mm_maddubs_epi16(s3_0_16x8b, coeff0_1_8x16b);

            /*load 8 pixel values */
            s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (-1 * src_strd)));

            /*load 8 pixel values */
            s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (0 * src_strd)));

            s3_1_16x8b = _mm_unpacklo_epi8(s2_2_16x8b, s2_3_16x8b);

            s1_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff2_3_8x16b);

            /*load 8 pixel values */
            s2_4_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (1 * src_strd)));

            /*load 8 pixel values */
            s2_5_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (2 * src_strd)));

            s3_2_16x8b = _mm_unpacklo_epi8(s2_4_16x8b, s2_5_16x8b);

            s2_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_6_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (3 * src_strd)));

            /*load 8 pixel values */
            s2_7_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (4 * src_strd)));

            s3_3_16x8b = _mm_unpacklo_epi8(s2_6_16x8b, s2_7_16x8b);

            s3_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff6_7_8x16b);

            s4_8x16b = _mm_add_epi16(s0_8x16b, s1_8x16b);
            s5_8x16b = _mm_add_epi16(s2_8x16b, s3_8x16b);
            s6_8x16b = _mm_add_epi16(s4_8x16b, s5_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 0*/
            _mm_store_si128((__m128i *)(pi2_dst), s6_8x16b);

            /* ROW 2*/
            s20_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff0_1_8x16b);
            s21_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff2_3_8x16b);
            s22_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_8_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (5 * src_strd)));

            /*load 8 pixel values */
            s2_9_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (6 * src_strd)));

            s3_4_16x8b = _mm_unpacklo_epi8(s2_8_16x8b, s2_9_16x8b);

            s23_8x16b = _mm_maddubs_epi16(s3_4_16x8b, coeff6_7_8x16b);

            s24_8x16b = _mm_add_epi16(s20_8x16b, s21_8x16b);
            s25_8x16b = _mm_add_epi16(s22_8x16b, s23_8x16b);
            s26_8x16b = _mm_add_epi16(s24_8x16b, s25_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 2*/
            _mm_store_si128((__m128i *)(pi2_dst + (2 * dst_strd)), s26_8x16b);


            /*ROW 1*/
            s4_0_16x8b = _mm_unpacklo_epi8(s2_1_16x8b, s2_2_16x8b);

            s10_8x16b = _mm_maddubs_epi16(s4_0_16x8b, coeff0_1_8x16b);

            s4_1_16x8b = _mm_unpacklo_epi8(s2_3_16x8b, s2_4_16x8b);

            s11_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff2_3_8x16b);

            s4_2_16x8b = _mm_unpacklo_epi8(s2_5_16x8b, s2_6_16x8b);

            s12_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff4_5_8x16b);

            s4_3_16x8b = _mm_unpacklo_epi8(s2_7_16x8b, s2_8_16x8b);

            s13_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff6_7_8x16b);

            s14_8x16b = _mm_add_epi16(s10_8x16b, s11_8x16b);
            s15_8x16b = _mm_add_epi16(s12_8x16b, s13_8x16b);
            s16_8x16b = _mm_add_epi16(s14_8x16b, s15_8x16b);


            /* store 8 8-bit output values  */
            /* Store the output pixels of row 1*/
            _mm_store_si128((__m128i *)(pi2_dst + (dst_strd)), s16_8x16b);


            /* ROW 3*/
            s30_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff0_1_8x16b);
            s31_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff2_3_8x16b);
            s32_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_10_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (7 * src_strd)));

            s4_4_16x8b = _mm_unpacklo_epi8(s2_9_16x8b, s2_10_16x8b);

            s33_8x16b = _mm_maddubs_epi16(s4_4_16x8b, coeff6_7_8x16b);

            s34_8x16b = _mm_add_epi16(s30_8x16b, s31_8x16b);
            s35_8x16b = _mm_add_epi16(s32_8x16b, s33_8x16b);
            s36_8x16b = _mm_add_epi16(s34_8x16b, s35_8x16b);


            /* store 8 8-bit output values  */
            /* Store the output pixels of row 2*/
            _mm_store_si128((__m128i *)(pi2_dst + (3 * dst_strd)), s36_8x16b);

            pu1_src += (8 * src_strd);
            pi2_dst += (4 * dst_strd);

            for(row = 4; row < ht; row += 4)
            {

                PREFETCH((char const *)(pu1_src + (4 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (5 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)

                s3_0_16x8b = s3_2_16x8b;
                s3_1_16x8b = s3_3_16x8b;
                s3_2_16x8b = s3_4_16x8b;

                s0_8x16b = _mm_maddubs_epi16(s3_0_16x8b, coeff0_1_8x16b);
                s1_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff2_3_8x16b);
                s2_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 4)th row*/
                s2_0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));

                s3_3_16x8b = _mm_unpacklo_epi8(s2_10_16x8b, s2_0_16x8b);
                s3_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff6_7_8x16b);

                s4_0_16x8b = s4_2_16x8b;
                s4_1_16x8b = s4_3_16x8b;
                s4_2_16x8b = s4_4_16x8b;

                s4_8x16b = _mm_add_epi16(s0_8x16b, s1_8x16b);
                s5_8x16b = _mm_add_epi16(s2_8x16b, s3_8x16b);
                s6_8x16b = _mm_add_epi16(s4_8x16b, s5_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of row 4*/
                _mm_store_si128((__m128i *)(pi2_dst), s6_8x16b);

                /* row + 2*/
                s20_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff0_1_8x16b);
                s21_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff2_3_8x16b);
                s22_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 5)th row*/
                s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + src_strd));

                /*load 8 pixel values from (cur_row + 6)th row*/
                s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (2 * src_strd)));

                /*unpacking (cur_row + 5)th row and (cur_row + 6)th row*/
                s3_4_16x8b = _mm_unpacklo_epi8(s2_1_16x8b, s2_2_16x8b);

                s23_8x16b = _mm_maddubs_epi16(s3_4_16x8b, coeff6_7_8x16b);

                s24_8x16b = _mm_add_epi16(s20_8x16b, s21_8x16b);
                s25_8x16b = _mm_add_epi16(s22_8x16b, s23_8x16b);
                s26_8x16b = _mm_add_epi16(s24_8x16b, s25_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row+2)*/
                _mm_store_si128((__m128i *)(pi2_dst + (2 * dst_strd)), s26_8x16b);


                /*row + 1*/
                s10_8x16b = _mm_maddubs_epi16(s4_0_16x8b, coeff0_1_8x16b);
                s11_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff2_3_8x16b);
                s12_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff4_5_8x16b);

                /*unpacking (cur_row + 4)th row and (cur_row + 5)th row*/
                s4_3_16x8b = _mm_unpacklo_epi8(s2_0_16x8b, s2_1_16x8b);
                s13_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff6_7_8x16b);

                s14_8x16b = _mm_add_epi16(s10_8x16b, s11_8x16b);
                s15_8x16b = _mm_add_epi16(s12_8x16b, s13_8x16b);
                s16_8x16b = _mm_add_epi16(s14_8x16b, s15_8x16b);


                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row + 1)*/
                _mm_store_si128((__m128i *)(pi2_dst + dst_strd), s16_8x16b);


                /* row + 3*/
                s30_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff0_1_8x16b);
                s31_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff2_3_8x16b);
                s32_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 7)th row*/
                s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (3 * src_strd)));

                /*unpacking (cur_row + 6)th row and (cur_row + 7)th row*/
                s4_4_16x8b = _mm_unpacklo_epi8(s2_2_16x8b, s2_3_16x8b);

                s33_8x16b = _mm_maddubs_epi16(s4_4_16x8b, coeff6_7_8x16b);

                s34_8x16b = _mm_add_epi16(s30_8x16b, s31_8x16b);
                s35_8x16b = _mm_add_epi16(s32_8x16b, s33_8x16b);
                s36_8x16b = _mm_add_epi16(s34_8x16b, s35_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row+3)*/
                _mm_store_si128((__m128i *)(pi2_dst + (3 * dst_strd)), s36_8x16b);

                s2_10_16x8b = s2_3_16x8b;


                pu1_src += 4 * src_strd; /* pointer update */
                pi2_dst += 4 * dst_strd; /* pointer update */
            }
        }
    }
    else /* wd = multiple of 8 case */
    {

        pu1_src_copy = pu1_src;
        pi2_dst_copy = pi2_dst;

        for(col = 0; col < wd; col += 4)
        {

            pu1_src = pu1_src_copy + col;
            pi2_dst = pi2_dst_copy + col;

            PREFETCH((char const *)(pu1_src + (8 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (9 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (10 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (11 * src_strd)), _MM_HINT_T0)

            /*load 8 pixel values */
            s2_0_16x8b  = _mm_loadl_epi64((__m128i *)(pu1_src + (-3 * src_strd)));

            /*load 8 pixel values */
            s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (-2 * src_strd)));

            s3_0_16x8b = _mm_unpacklo_epi8(s2_0_16x8b, s2_1_16x8b);

            s0_8x16b = _mm_maddubs_epi16(s3_0_16x8b, coeff0_1_8x16b);

            /*load 8 pixel values */
            s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (-1 * src_strd)));

            /*load 8 pixel values */
            s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (0 * src_strd)));

            s3_1_16x8b = _mm_unpacklo_epi8(s2_2_16x8b, s2_3_16x8b);

            s1_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff2_3_8x16b);

            /*load 8 pixel values */
            s2_4_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (1 * src_strd)));

            /*load 8 pixel values */
            s2_5_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (2 * src_strd)));

            s3_2_16x8b = _mm_unpacklo_epi8(s2_4_16x8b, s2_5_16x8b);

            s2_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_6_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (3 * src_strd)));

            /*load 8 pixel values */
            s2_7_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (4 * src_strd)));

            s3_3_16x8b = _mm_unpacklo_epi8(s2_6_16x8b, s2_7_16x8b);

            s3_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff6_7_8x16b);

            s4_8x16b = _mm_add_epi16(s0_8x16b, s1_8x16b);
            s5_8x16b = _mm_add_epi16(s2_8x16b, s3_8x16b);
            s6_8x16b = _mm_add_epi16(s4_8x16b, s5_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 0*/
            _mm_storel_epi64((__m128i *)(pi2_dst), s6_8x16b);

            /* ROW 2*/
            s20_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff0_1_8x16b);
            s21_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff2_3_8x16b);
            s22_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_8_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (5 * src_strd)));

            /*load 8 pixel values */
            s2_9_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (6 * src_strd)));

            s3_4_16x8b = _mm_unpacklo_epi8(s2_8_16x8b, s2_9_16x8b);

            s23_8x16b = _mm_maddubs_epi16(s3_4_16x8b, coeff6_7_8x16b);

            s24_8x16b = _mm_add_epi16(s20_8x16b, s21_8x16b);
            s25_8x16b = _mm_add_epi16(s22_8x16b, s23_8x16b);
            s26_8x16b = _mm_add_epi16(s24_8x16b, s25_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 2*/
            _mm_storel_epi64((__m128i *)(pi2_dst + (2 * dst_strd)), s26_8x16b);


            /*ROW 1*/
            s4_0_16x8b = _mm_unpacklo_epi8(s2_1_16x8b, s2_2_16x8b);

            s10_8x16b = _mm_maddubs_epi16(s4_0_16x8b, coeff0_1_8x16b);

            s4_1_16x8b = _mm_unpacklo_epi8(s2_3_16x8b, s2_4_16x8b);

            s11_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff2_3_8x16b);

            s4_2_16x8b = _mm_unpacklo_epi8(s2_5_16x8b, s2_6_16x8b);

            s12_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff4_5_8x16b);

            s4_3_16x8b = _mm_unpacklo_epi8(s2_7_16x8b, s2_8_16x8b);

            s13_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff6_7_8x16b);

            s14_8x16b = _mm_add_epi16(s10_8x16b, s11_8x16b);
            s15_8x16b = _mm_add_epi16(s12_8x16b, s13_8x16b);
            s16_8x16b = _mm_add_epi16(s14_8x16b, s15_8x16b);


            /* store 8 8-bit output values  */
            /* Store the output pixels of row 1*/
            _mm_storel_epi64((__m128i *)(pi2_dst + (dst_strd)), s16_8x16b);


            /* ROW 3*/
            s30_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff0_1_8x16b);
            s31_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff2_3_8x16b);
            s32_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff4_5_8x16b);

            /*load 8 pixel values */
            s2_10_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (7 * src_strd)));

            s4_4_16x8b = _mm_unpacklo_epi8(s2_9_16x8b, s2_10_16x8b);

            s33_8x16b = _mm_maddubs_epi16(s4_4_16x8b, coeff6_7_8x16b);

            s34_8x16b = _mm_add_epi16(s30_8x16b, s31_8x16b);
            s35_8x16b = _mm_add_epi16(s32_8x16b, s33_8x16b);
            s36_8x16b = _mm_add_epi16(s34_8x16b, s35_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 2*/
            _mm_storel_epi64((__m128i *)(pi2_dst + (3 * dst_strd)), s36_8x16b);

            pu1_src += (8 * src_strd);
            pi2_dst += (4 * dst_strd);

            for(row = 4; row < ht; row += 4)
            {

                PREFETCH((char const *)(pu1_src + (4 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (5 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)

                s3_0_16x8b = s3_2_16x8b;
                s3_1_16x8b = s3_3_16x8b;
                s3_2_16x8b = s3_4_16x8b;

                s0_8x16b = _mm_maddubs_epi16(s3_0_16x8b, coeff0_1_8x16b);
                s1_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff2_3_8x16b);
                s2_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 4)th row*/
                s2_0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));

                s3_3_16x8b = _mm_unpacklo_epi8(s2_10_16x8b, s2_0_16x8b);
                s3_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff6_7_8x16b);

                s4_0_16x8b = s4_2_16x8b;
                s4_1_16x8b = s4_3_16x8b;
                s4_2_16x8b = s4_4_16x8b;

                s4_8x16b = _mm_add_epi16(s0_8x16b, s1_8x16b);
                s5_8x16b = _mm_add_epi16(s2_8x16b, s3_8x16b);
                s6_8x16b = _mm_add_epi16(s4_8x16b, s5_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of row 4*/
                _mm_storel_epi64((__m128i *)(pi2_dst), s6_8x16b);

                /* row + 2*/
                s20_8x16b = _mm_maddubs_epi16(s3_1_16x8b, coeff0_1_8x16b);
                s21_8x16b = _mm_maddubs_epi16(s3_2_16x8b, coeff2_3_8x16b);
                s22_8x16b = _mm_maddubs_epi16(s3_3_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 5)th row*/
                s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + src_strd));

                /*load 8 pixel values from (cur_row + 6)th row*/
                s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (2 * src_strd)));

                /*unpacking (cur_row + 5)th row and (cur_row + 6)th row*/
                s3_4_16x8b = _mm_unpacklo_epi8(s2_1_16x8b, s2_2_16x8b);

                s23_8x16b = _mm_maddubs_epi16(s3_4_16x8b, coeff6_7_8x16b);

                s24_8x16b = _mm_add_epi16(s20_8x16b, s21_8x16b);
                s25_8x16b = _mm_add_epi16(s22_8x16b, s23_8x16b);
                s26_8x16b = _mm_add_epi16(s24_8x16b, s25_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row+2)*/
                _mm_storel_epi64((__m128i *)(pi2_dst + (2 * dst_strd)), s26_8x16b);


                /*row + 1*/
                s10_8x16b = _mm_maddubs_epi16(s4_0_16x8b, coeff0_1_8x16b);
                s11_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff2_3_8x16b);
                s12_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff4_5_8x16b);

                /*unpacking (cur_row + 4)th row and (cur_row + 5)th row*/
                s4_3_16x8b = _mm_unpacklo_epi8(s2_0_16x8b, s2_1_16x8b);
                s13_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff6_7_8x16b);

                s14_8x16b = _mm_add_epi16(s10_8x16b, s11_8x16b);
                s15_8x16b = _mm_add_epi16(s12_8x16b, s13_8x16b);
                s16_8x16b = _mm_add_epi16(s14_8x16b, s15_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row + 1)*/
                _mm_storel_epi64((__m128i *)(pi2_dst + dst_strd), s16_8x16b);


                /* row + 3*/
                s30_8x16b = _mm_maddubs_epi16(s4_1_16x8b, coeff0_1_8x16b);
                s31_8x16b = _mm_maddubs_epi16(s4_2_16x8b, coeff2_3_8x16b);
                s32_8x16b = _mm_maddubs_epi16(s4_3_16x8b, coeff4_5_8x16b);

                /*load 8 pixel values from (cur_row + 7)th row*/
                s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + (3 * src_strd)));

                /*unpacking (cur_row + 6)th row and (cur_row + 7)th row*/
                s4_4_16x8b = _mm_unpacklo_epi8(s2_2_16x8b, s2_3_16x8b);

                s33_8x16b = _mm_maddubs_epi16(s4_4_16x8b, coeff6_7_8x16b);

                s34_8x16b = _mm_add_epi16(s30_8x16b, s31_8x16b);
                s35_8x16b = _mm_add_epi16(s32_8x16b, s33_8x16b);
                s36_8x16b = _mm_add_epi16(s34_8x16b, s35_8x16b);

                /* store 8 8-bit output values  */
                /* Store the output pixels of (cur_row+3)*/
                _mm_storel_epi64((__m128i *)(pi2_dst + (3 * dst_strd)), s36_8x16b);

                s2_10_16x8b = s2_3_16x8b;

                pu1_src += 4 * src_strd; /* pointer update */
                pi2_dst += 4 * dst_strd; /* pointer update */
            }
        }
    }
}